

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O0

void __thiscall
Js::SimpleDictionaryTypeHandlerBase<int,Js::PropertyRecord_const*,false>::
Add<Memory::WriteBarrierPtr<Js::PropertyRecord_const>>
          (SimpleDictionaryTypeHandlerBase<int,Js::PropertyRecord_const*,false> *this,
          int propertyIndex,WriteBarrierPtr<const_Js::PropertyRecord> *propertyKey,
          PropertyAttributes attributes,bool isInitialized,bool isFixed,bool usedAsFixed,
          ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  PropertyRecord **ppPVar3;
  RecyclerWeakReference<Js::DynamicObject> **ppRVar4;
  undefined4 *puVar5;
  BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
  *this_00;
  PrototypeChainCache<Js::NoSpecialPropertyCache> *this_01;
  PrototypeChainCache<Js::OnlyWritablePropertyCache> *this_02;
  WriteBarrierPtr<const_Js::PropertyRecord> local_60;
  undefined1 local_58 [24];
  Type local_40;
  SimpleDictionaryPropertyDescriptor<int> local_38;
  SimpleDictionaryPropertyDescriptor<int> descriptor;
  JavascriptLibrary *library;
  bool usedAsFixed_local;
  bool isFixed_local;
  bool isInitialized_local;
  PropertyAttributes attributes_local;
  WriteBarrierPtr<const_Js::PropertyRecord> *propertyKey_local;
  int propertyIndex_local;
  SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false> *this_local;
  
  descriptor = (SimpleDictionaryPropertyDescriptor<int>)ScriptContext::GetLibrary(scriptContext);
  ppPVar3 = Memory::WriteBarrierPtr::operator_cast_to_PropertyRecord__
                      ((WriteBarrierPtr *)propertyKey);
  if (*ppPVar3 == (PropertyRecord *)0x0) {
    return;
  }
  SimpleDictionaryPropertyDescriptor<int>::SimpleDictionaryPropertyDescriptor
            (&local_38,propertyIndex,attributes);
  if ((isFixed) || (usedAsFixed)) {
    ppPVar3 = Memory::WriteBarrierPtr::operator_cast_to_PropertyRecord__
                        ((WriteBarrierPtr *)propertyKey);
    bVar2 = TPropertyKey_IsInternalPropertyId(*ppPVar3);
    if ((bVar2) ||
       (ppRVar4 = Memory::WriteBarrierPtr::operator_cast_to_RecyclerWeakReference__
                            ((WriteBarrierPtr *)(this + 0x20)),
       *ppRVar4 == (RecyclerWeakReference<Js::DynamicObject> *)0x0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                  ,0x41c,
                                  "((!isFixed && !usedAsFixed) || (!TPropertyKey_IsInternalPropertyId(propertyKey) && this->singletonInstance != nullptr))"
                                  ,
                                  "(!isFixed && !usedAsFixed) || (!TPropertyKey_IsInternalPropertyId(propertyKey) && this->singletonInstance != nullptr)"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
  }
  ppPVar3 = Memory::WriteBarrierPtr::operator_cast_to_PropertyRecord__
                      ((WriteBarrierPtr *)propertyKey);
  bVar2 = TPropertyKey_IsInternalPropertyId(*ppPVar3);
  if (!bVar2) {
    ppPVar3 = Memory::WriteBarrierPtr::operator_cast_to_PropertyRecord__
                        ((WriteBarrierPtr *)propertyKey);
    bVar2 = TMapKey_IsSymbol(*ppPVar3,scriptContext);
    if (!bVar2) goto LAB_014baab1;
  }
  bVar2 = TMapKey_IsJavascriptString<Js::PropertyRecord_const*>();
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x41f,"(!TMapKey_IsJavascriptString<TMapKey>())",
                                "!TMapKey_IsJavascriptString<TMapKey>()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  this[0x28] = (SimpleDictionaryTypeHandlerBase<int,Js::PropertyRecord_const*,false>)
               ((byte)this[0x28] & 0xfb | 4);
LAB_014baab1:
  local_38._0_1_ = local_38._0_1_ & 0xf1 | isInitialized << 1 | isFixed << 2 | usedAsFixed << 3;
  this_00 = Memory::
            WriteBarrierPtr<JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>_>
            ::operator->((WriteBarrierPtr<JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>_>
                          *)(this + 0x18));
  ppPVar3 = Memory::WriteBarrierPtr::operator_cast_to_PropertyRecord__
                      ((WriteBarrierPtr *)propertyKey);
  local_40.ptr = (GlobalObject *)
                 TMapKey_ConvertKey<Js::PropertyRecord_const*>(scriptContext,*ppPVar3);
  JsUtil::
  BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
  ::Add(this_00,(PropertyRecord **)&local_40,&local_38);
  JavascriptLibrary::GetTypesWithNoSpecialPropertyProtoChainCache
            ((JavascriptLibrary *)(local_58 + 0x10));
  this_01 = Memory::WriteBarrierPtr<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_>::
            operator->((WriteBarrierPtr<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_> *)
                       (local_58 + 0x10));
  Memory::WriteBarrierPtr<const_Js::PropertyRecord>::WriteBarrierPtr
            ((WriteBarrierPtr<const_Js::PropertyRecord> *)(local_58 + 8),propertyKey);
  PrototypeChainCache<Js::NoSpecialPropertyCache>::
  ProcessProperty<Memory::WriteBarrierPtr<Js::PropertyRecord_const>>
            (this_01,(DynamicTypeHandler *)this,attributes,
             (WriteBarrierPtr<const_Js::PropertyRecord> *)(local_58 + 8),scriptContext);
  JavascriptLibrary::GetTypesWithOnlyWritablePropertyProtoChainCache((JavascriptLibrary *)local_58);
  this_02 = Memory::WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>::
            operator->((WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_> *)
                       local_58);
  Memory::WriteBarrierPtr<const_Js::PropertyRecord>::WriteBarrierPtr(&local_60,propertyKey);
  PrototypeChainCache<Js::OnlyWritablePropertyCache>::
  ProcessProperty<Memory::WriteBarrierPtr<Js::PropertyRecord_const>>
            (this_02,(DynamicTypeHandler *)this,attributes,&local_60,scriptContext);
  return;
}

Assistant:

void SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::Add(
        TPropertyIndex propertyIndex,
        TPropertyKey propertyKey,
        PropertyAttributes attributes,
        bool isInitialized, bool isFixed, bool usedAsFixed,
        ScriptContext *const scriptContext)
    {
        JavascriptLibrary* library = scriptContext->GetLibrary();
        //
        // For a function with same named parameters,
        // property id Constants::NoProperty will be passed for all the dups except the last one
        // We need to allocate space for dups, but don't add those to map
        if (propertyKey != NULL)
        {
            SimpleDictionaryPropertyDescriptor<TPropertyIndex> descriptor(propertyIndex, attributes);
            Assert((!isFixed && !usedAsFixed) || (!TPropertyKey_IsInternalPropertyId(propertyKey) && this->singletonInstance != nullptr));
            if (TPropertyKey_IsInternalPropertyId(propertyKey) || TMapKey_IsSymbol(propertyKey, scriptContext))
            {
                Assert(!TMapKey_IsJavascriptString<TMapKey>());
                hasNamelessPropertyId = true;
            }
#if ENABLE_FIXED_FIELDS
            descriptor.isInitialized = isInitialized;
            descriptor.isFixed = isFixed;
            descriptor.usedAsFixed = usedAsFixed;
#endif
            propertyMap->Add(TMapKey_ConvertKey<TMapKey>(scriptContext, propertyKey), descriptor);

            library->GetTypesWithNoSpecialPropertyProtoChainCache()->ProcessProperty(this, attributes, propertyKey, scriptContext);
            library->GetTypesWithOnlyWritablePropertyProtoChainCache()->ProcessProperty(this, attributes, propertyKey, scriptContext);
        }
    }